

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void writePrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,char *filename,NameSet *colnames,NameSet *rownames,bool real,bool rational,
               bool append)

{
  byte bVar1;
  Tolerances *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  undefined3 in_register_00000081;
  undefined4 uVar12;
  long lVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  char *pcVar15;
  byte bVar16;
  Real RVar17;
  undefined8 extraout_XMM0_Qb;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  VectorRational primal_1;
  ofstream outfile;
  undefined8 local_468;
  undefined4 local_460;
  int local_45c;
  NameSet *local_458;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_450;
  double local_438;
  undefined8 uStack_430;
  ulong local_428;
  long local_420;
  data_type local_418;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [13];
  undefined3 uStack_3ab;
  undefined5 uStack_3a8;
  undefined8 local_3a0;
  long local_398;
  undefined1 local_390 [128];
  long local_310;
  filebuf local_308 [8];
  double dStack_300;
  uint auStack_2f8 [56];
  ios_base local_218 [264];
  undefined4 local_110 [28];
  undefined4 local_a0 [28];
  
  uVar12 = CONCAT31(in_register_00000081,real);
  bVar16 = 0;
  pTVar2 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var14 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
    }
  }
  local_458 = colnames;
  RVar17 = ::soplex::Tolerances::epsilon(pTVar2);
  local_438 = log10(RVar17);
  uStack_430 = extraout_XMM0_Qb;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  std::ofstream::ofstream(&local_310);
  std::ofstream::open((char *)&local_310,(_Ios_Openmode)filename);
  local_428 = (ulong)(uint)(int)-local_438;
  local_45c = (int)-local_438 + 10;
  if ((char)rownames == '\0') goto LAB_0014570b;
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_450,
               (soplex->_realLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  bVar3 = ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getPrimalRay(soplex,&local_450);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_310,"\nPrimal ray (name, value):\n",0x1b);
    local_460 = uVar12;
    if (0 < (soplex->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_468 = (long)local_45c;
      local_420 = (long)(int)local_428;
      lVar9 = 0;
      lVar13 = 0;
      do {
        puVar10 = (undefined4 *)
                  ((long)((local_450.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  lVar9);
        puVar11 = local_a0;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar11 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
          puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
        }
        iVar4 = *(int *)((long)(&((local_450.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1)
                        + lVar9);
        bVar1 = *(byte *)((long)(&((local_450.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1)
                         + lVar9 + 4);
        local_438 = *(double *)
                     ((long)(&((local_450.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                     lVar9 + 8);
        uStack_430 = 0;
        pTVar2 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var14 = (soplex->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        RVar17 = ::soplex::Tolerances::epsilon(pTVar2);
        puVar10 = local_a0;
        puVar11 = (undefined4 *)local_390;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar11 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
          puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
        }
        local_390._120_8_ = local_438;
        local_390[0x74] = bVar1;
        if ((bVar1 != 0) && (local_390._0_4_ != 0 || local_438._0_4_ != 0)) {
          local_390[0x74] = bVar1 ^ 1;
        }
        bVar3 = false;
        local_390._112_4_ = iVar4;
        if ((local_438._0_4_ != 2) && (!NAN(RVar17))) {
          local_3a0 = 0x1c00000000;
          local_418.double_first = 0;
          local_408 = (undefined1  [16])0x0;
          local_3f8 = (undefined1  [16])0x0;
          local_3e8 = (undefined1  [16])0x0;
          local_3d8 = (undefined1  [16])0x0;
          local_3c8 = (undefined1  [16])0x0;
          local_3b8 = SUB1613((undefined1  [16])0x0,0);
          uStack_3ab = 0;
          uStack_3a8 = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_418.ld,RVar17);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_390,
                             (cpp_dec_float<200U,_int,_void> *)&local_418.ld);
          bVar3 = 0 < iVar4;
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
        if (bVar3) {
          if (local_458->mem == (char *)0x0) {
            std::ios::clear((int)&local_468 + (int)*(undefined8 *)(local_310 + -0x18) + 0x158);
          }
          else {
            pcVar15 = local_458->mem +
                      (local_458->set).theitem[(local_458->set).thekey[lVar13].idx].data;
            sVar6 = strlen(pcVar15);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_310,pcVar15,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_310,"\t",1);
          *(long *)((long)&dStack_300 + *(long *)(local_310 + -0x18)) = local_468;
          *(long *)(local_308 + *(long *)(local_310 + -0x18)) = local_420;
          poVar7 = boost::multiprecision::operator<<
                             ((ostream *)&local_310,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)((local_450.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                        data._M_elems + lVar9));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        lVar13 = lVar13 + 1;
        lVar9 = lVar9 + 0x80;
      } while (lVar13 < (soplex->_realLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_310,"All other entries are zero (within ",0x23);
    uVar12 = local_460;
    *(undefined8 *)(local_308 + *(long *)(local_310 + -0x18)) = 1;
    *(uint *)((long)auStack_2f8 + *(long *)(local_310 + -0x18)) =
         *(uint *)((long)auStack_2f8 + *(long *)(local_310 + -0x18)) & 0xfffffefb | 0x100;
    pTVar2 = (soplex->_tolerances).
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var14 = (soplex->_tolerances).
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    RVar17 = ::soplex::Tolerances::epsilon(pTVar2);
    poVar7 = std::ostream::_M_insert<double>(RVar17);
    lVar9 = *(long *)poVar7;
    *(undefined8 *)(poVar7 + *(long *)(lVar9 + -0x18) + 8) = 8;
    lVar9 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar7 + lVar9 + 0x18) = *(uint *)(poVar7 + lVar9 + 0x18) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,").",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
LAB_001456e7:
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
  }
  else {
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x110 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimal(soplex,&local_450), bVar3)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        local_468 = (ulong)local_468._4_4_ << 0x20;
        local_460 = uVar12;
      }
      else {
        local_420 = (long)local_45c;
        local_398 = (long)(int)local_428;
        lVar13 = 0;
        lVar9 = 0;
        local_468 = (ulong)local_468._4_4_ << 0x20;
        local_460 = uVar12;
        do {
          puVar10 = (undefined4 *)
                    ((long)((local_450.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar13);
          puVar11 = local_110;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar11 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
          }
          iVar4 = *(int *)((long)(&((local_450.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1
                                 ) + lVar13);
          bVar1 = *(byte *)((long)(&((local_450.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                                  1) + lVar13 + 4);
          local_438 = *(double *)
                       ((long)(&((local_450.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + 1) +
                       lVar13 + 8);
          uStack_430 = 0;
          pTVar2 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var14 = (soplex->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
          }
          RVar17 = ::soplex::Tolerances::epsilon(pTVar2);
          puVar10 = local_110;
          puVar11 = (undefined4 *)local_390;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar11 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
          }
          local_390._120_8_ = local_438;
          local_390[0x74] = bVar1;
          if ((bVar1 != 0) && (local_390._0_4_ != 0 || local_438._0_4_ != 0)) {
            local_390[0x74] = bVar1 ^ 1;
          }
          bVar3 = false;
          local_390._112_4_ = iVar4;
          if ((local_438._0_4_ != 2) && (!NAN(RVar17))) {
            local_3a0 = 0x1c00000000;
            local_418.double_first = 0;
            local_408 = (undefined1  [16])0x0;
            local_3f8 = (undefined1  [16])0x0;
            local_3e8 = (undefined1  [16])0x0;
            local_3d8 = (undefined1  [16])0x0;
            local_3c8 = (undefined1  [16])0x0;
            local_3b8 = SUB1613((undefined1  [16])0x0,0);
            uStack_3ab = 0;
            uStack_3a8 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_418.ld,RVar17);
            iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_390,
                               (cpp_dec_float<200U,_int,_void> *)&local_418.ld);
            bVar3 = 0 < iVar4;
          }
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
          }
          if (bVar3) {
            if (local_458->mem == (char *)0x0) {
              std::ios::clear((int)&local_468 + (int)*(undefined8 *)(local_310 + -0x18) + 0x158);
            }
            else {
              pcVar15 = local_458->mem +
                        (local_458->set).theitem[(local_458->set).thekey[lVar9].idx].data;
              sVar6 = strlen(pcVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_310,pcVar15,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_310,"\t",1);
            *(long *)((long)&dStack_300 + *(long *)(local_310 + -0x18)) = local_420;
            *(long *)(local_308 + *(long *)(local_310 + -0x18)) = local_398;
            poVar7 = boost::multiprecision::operator<<
                               ((ostream *)&local_310,
                                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)((local_450.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          data._M_elems + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            local_468 = CONCAT44(local_468._4_4_,(int)local_468 + 1);
          }
          lVar9 = lVar9 + 1;
          lVar13 = lVar13 + 0x80;
        } while (lVar9 < (soplex->_realLP->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"All other variables are zero (within ",0x25);
      uVar12 = local_460;
      *(undefined8 *)(local_308 + *(long *)(local_310 + -0x18)) = 1;
      *(uint *)((long)auStack_2f8 + *(long *)(local_310 + -0x18)) =
           *(uint *)((long)auStack_2f8 + *(long *)(local_310 + -0x18)) & 0xfffffefb | 0x100;
      pTVar2 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = (soplex->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      RVar17 = ::soplex::Tolerances::epsilon(pTVar2);
      poVar7 = std::ostream::_M_insert<double>(RVar17);
      lVar9 = *(long *)poVar7;
      *(undefined8 *)(poVar7 + *(long *)(lVar9 + -0x18) + 8) = 8;
      lVar9 = *(long *)(lVar9 + -0x18);
      *(uint *)(poVar7 + lVar9 + 0x18) = *(uint *)(poVar7 + lVar9 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"). Solution has ",0x10);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)local_468);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      goto LAB_001456e7;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_310,"No primal information available.\n",0x21);
  }
  if (local_450.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_450.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_450.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0014570b:
  if ((char)uVar12 != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)local_390,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar3 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)local_390);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"\nPrimal ray (name, value):\n",0x1b);
      if (0 < (soplex->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_438 = (double)(long)local_45c;
        local_468 = (long)(int)local_428;
        lVar9 = 0;
        lVar13 = 0;
        do {
          lVar8 = CONCAT44(local_390._4_4_,local_390._0_4_);
          local_450.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_418.ld,(longlong *)&local_450,(type *)0x0);
          iVar4 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)(lVar8 + lVar9),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_418.ld);
          if ((local_3e8[5] == '\0') && (local_3e8[6] == '\0')) {
            operator_delete((void *)local_3f8._8_8_,(ulong)(uint)local_3f8._0_4_ << 3);
          }
          if ((local_408[5] == '\0') && (local_408[6] == '\0')) {
            operator_delete(local_418.ld.data,(ulong)local_418.ld.capacity << 3);
          }
          if (iVar4 != 0) {
            if (local_458->mem == (char *)0x0) {
              std::ios::clear((int)&local_468 + (int)*(undefined8 *)(local_310 + -0x18) + 0x158);
            }
            else {
              pcVar15 = local_458->mem +
                        (local_458->set).theitem[(local_458->set).thekey[lVar13].idx].data;
              sVar6 = strlen(pcVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_310,pcVar15,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_310,"\t",1);
            *(double *)((long)&dStack_300 + *(long *)(local_310 + -0x18)) = local_438;
            *(long *)(local_308 + *(long *)(local_310 + -0x18)) = local_468;
            poVar7 = boost::multiprecision::operator<<
                               ((ostream *)&local_310,
                                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)(CONCAT44(local_390._4_4_,local_390._0_4_) + lVar9));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          lVar13 = lVar13 + 1;
          lVar9 = lVar9 + 0x40;
        } while (lVar13 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"All other entries are zero.",0x1b);
      std::ios::widen((char)(ostream *)&local_310 + (char)*(undefined8 *)(local_310 + -0x18));
      std::ostream::put((char)&local_310);
      std::ostream::flush();
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x110 & 1) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
       (bVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                            *)local_390), bVar3)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"\nPrimal solution (name, value):\n",0x20);
      if ((soplex->_rationalLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum < 1) {
        iVar4 = 0;
      }
      else {
        lVar9 = 0;
        lVar13 = 0;
        iVar4 = 0;
        do {
          lVar8 = CONCAT44(local_390._4_4_,local_390._0_4_);
          local_450.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_418.ld,(longlong *)&local_450,(type *)0x0);
          iVar5 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)(lVar8 + lVar9),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_418.ld);
          if ((local_3e8[5] == '\0') && (local_3e8[6] == '\0')) {
            operator_delete((void *)local_3f8._8_8_,(ulong)(uint)local_3f8._0_4_ << 3);
          }
          if ((local_408[5] == '\0') && (local_408[6] == '\0')) {
            operator_delete(local_418.ld.data,(ulong)local_418.ld.capacity << 3);
          }
          if (iVar5 != 0) {
            if (local_458->mem == (char *)0x0) {
              std::ios::clear((int)&local_468 + (int)*(undefined8 *)(local_310 + -0x18) + 0x158);
            }
            else {
              pcVar15 = local_458->mem +
                        (local_458->set).theitem[(local_458->set).thekey[lVar13].idx].data;
              sVar6 = strlen(pcVar15);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_310,pcVar15,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_310,"\t",1);
            poVar7 = boost::multiprecision::operator<<
                               ((ostream *)&local_310,
                                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)(CONCAT44(local_390._4_4_,local_390._0_4_) + lVar9));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            iVar4 = iVar4 + 1;
          }
          lVar13 = lVar13 + 1;
          lVar9 = lVar9 + 0x40;
        } while (lVar13 < (soplex->_rationalLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"All other variables are zero. Solution has ",0x2b);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_310,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," nonzero entries.",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_310,"No primal (rational) solution available.\n",0x29);
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               *)local_390);
  }
  local_310 = _VTT;
  *(undefined8 *)(local_308 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_308);
  std::ios_base::~ios_base(local_218);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}